

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrViewConfigurationType value)

{
  pointer pbVar1;
  int iVar2;
  pointer pbVar3;
  bool bVar4;
  string vuid;
  string error_str;
  string local_a8;
  string local_88;
  GenValidUsageXrInstanceInfo *local_68;
  string *local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_58;
  string *local_50;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  if (value - XR_VIEW_CONFIGURATION_TYPE_PRIMARY_MONO < 2) {
    return true;
  }
  if (value == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_QUAD_VARJO) {
    return true;
  }
  if (value == XR_VIEW_CONFIGURATION_TYPE_SECONDARY_MONO_FIRST_PERSON_OBSERVER_MSFT) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    local_68 = instance_info;
    local_60 = command_name;
    local_58 = objects_info;
    local_50 = item_name;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (bVar4) {
      return true;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(validation_name->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a8);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(local_50->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "XrViewConfigurationType value \"XR_VIEW_CONFIGURATION_TYPE_SECONDARY_MONO_FIRST_PERSON_OBSERVER_MSFT\""
               ,"");
    std::__cxx11::string::append((char *)&local_88);
    std::__cxx11::string::append((char *)&local_88);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_48,local_58);
    CoreValidLogMessage(local_68,&local_a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_60,&local_48,
                        &local_88);
    if (local_48.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrViewConfigurationType value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    switch (value) {
        case XR_VIEW_CONFIGURATION_TYPE_PRIMARY_MONO:
            return true;
        case XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO:
            return true;
        case XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO_WITH_FOVEATED_INSET:
            return true;
        case XR_VIEW_CONFIGURATION_TYPE_SECONDARY_MONO_FIRST_PERSON_OBSERVER_MSFT:
            // Enum value XR_VIEW_CONFIGURATION_TYPE_SECONDARY_MONO_FIRST_PERSON_OBSERVER_MSFT requires extension XR_MSFT_first_person_observer, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_first_person_observer")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrViewConfigurationType value \"XR_VIEW_CONFIGURATION_TYPE_SECONDARY_MONO_FIRST_PERSON_OBSERVER_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_first_person_observer\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}